

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O0

int SetRudderThrustersFluxSSC32
              (SSC32 *pSSC32,double angle,double urt,double ult,double urf,double ulf)

{
  int iVar1;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  double local_198;
  double local_188;
  double local_178;
  double local_160;
  double local_158;
  double angletmp;
  int pws [32];
  int selectedchannels [32];
  double ulf_local;
  double urf_local;
  double ult_local;
  double urt_local;
  double angle_local;
  SSC32 *pSSC32_local;
  
  memset(pws + 0x1e,0,0x80);
  memset(&angletmp,0,0x80);
  if (angle < 0.0) {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_178 = pSSC32->MaxAngle;
    }
    else {
      local_178 = pSSC32->MinAngle;
    }
    local_178 = ABS(local_178);
    local_160 = pSSC32->MidAngle + (angle * (pSSC32->MidAngle - pSSC32->MinAngle)) / local_178;
  }
  else {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_158 = pSSC32->MaxAngle;
    }
    else {
      local_158 = pSSC32->MinAngle;
    }
    local_158 = ABS(local_158);
    local_160 = pSSC32->MidAngle + (angle * (pSSC32->MaxAngle - pSSC32->MidAngle)) / local_158;
  }
  if (local_160 < 0.0) {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_198 = pSSC32->MaxAngle;
    }
    else {
      local_198 = pSSC32->MinAngle;
    }
    local_198 = ABS(local_198);
    pws[(long)pSSC32->rudderchan + -2] = (int)((local_160 * 500.0) / local_198) + 0x5dc;
  }
  else {
    if (ABS(pSSC32->MinAngle) <= ABS(pSSC32->MaxAngle)) {
      local_188 = pSSC32->MaxAngle;
    }
    else {
      local_188 = pSSC32->MinAngle;
    }
    local_188 = ABS(local_188);
    pws[(long)pSSC32->rudderchan + -2] = (int)((local_160 * 500.0) / local_188) + 0x5dc;
  }
  pws[(long)pSSC32->rightthrusterchan + -2] = (int)((urt * 1000.0) / 2.0) + 0x5dc;
  pws[(long)pSSC32->leftthrusterchan + -2] = (int)((ult * 1000.0) / 2.0) + 0x5dc;
  pws[(long)pSSC32->rightfluxchan + -2] = (int)((urf * 1000.0) / 2.0) + 0x5dc;
  pws[(long)pSSC32->leftfluxchan + -2] = (int)((ulf * 1000.0) / 2.0) + 0x5dc;
  if (pws[(long)pSSC32->rudderchan + -2] < 2000) {
    local_19c = pws[(long)pSSC32->rudderchan + -2];
  }
  else {
    local_19c = 2000;
  }
  if (local_19c < 0x3e9) {
    local_1a4 = 1000;
  }
  else {
    if (pws[(long)pSSC32->rudderchan + -2] < 2000) {
      local_1a0 = pws[(long)pSSC32->rudderchan + -2];
    }
    else {
      local_1a0 = 2000;
    }
    local_1a4 = local_1a0;
  }
  pws[(long)pSSC32->rudderchan + -2] = local_1a4;
  if (pws[(long)pSSC32->rightthrusterchan + -2] < 2000) {
    local_1a8 = pws[(long)pSSC32->rightthrusterchan + -2];
  }
  else {
    local_1a8 = 2000;
  }
  if (local_1a8 < 0x3e9) {
    local_1b0 = 1000;
  }
  else {
    if (pws[(long)pSSC32->rightthrusterchan + -2] < 2000) {
      local_1ac = pws[(long)pSSC32->rightthrusterchan + -2];
    }
    else {
      local_1ac = 2000;
    }
    local_1b0 = local_1ac;
  }
  pws[(long)pSSC32->rightthrusterchan + -2] = local_1b0;
  if (pws[(long)pSSC32->leftthrusterchan + -2] < 2000) {
    local_1b4 = pws[(long)pSSC32->leftthrusterchan + -2];
  }
  else {
    local_1b4 = 2000;
  }
  if (local_1b4 < 0x3e9) {
    local_1bc = 1000;
  }
  else {
    if (pws[(long)pSSC32->leftthrusterchan + -2] < 2000) {
      local_1b8 = pws[(long)pSSC32->leftthrusterchan + -2];
    }
    else {
      local_1b8 = 2000;
    }
    local_1bc = local_1b8;
  }
  pws[(long)pSSC32->leftthrusterchan + -2] = local_1bc;
  if (pws[(long)pSSC32->rightfluxchan + -2] < 2000) {
    local_1c0 = pws[(long)pSSC32->rightfluxchan + -2];
  }
  else {
    local_1c0 = 2000;
  }
  if (local_1c0 < 0x3e9) {
    local_1c8 = 1000;
  }
  else {
    if (pws[(long)pSSC32->rightfluxchan + -2] < 2000) {
      local_1c4 = pws[(long)pSSC32->rightfluxchan + -2];
    }
    else {
      local_1c4 = 2000;
    }
    local_1c8 = local_1c4;
  }
  pws[(long)pSSC32->rightfluxchan + -2] = local_1c8;
  if (pws[(long)pSSC32->leftfluxchan + -2] < 2000) {
    local_1cc = pws[(long)pSSC32->leftfluxchan + -2];
  }
  else {
    local_1cc = 2000;
  }
  if (local_1cc < 0x3e9) {
    local_1d4 = 1000;
  }
  else {
    if (pws[(long)pSSC32->leftfluxchan + -2] < 2000) {
      local_1d0 = pws[(long)pSSC32->leftfluxchan + -2];
    }
    else {
      local_1d0 = 2000;
    }
    local_1d4 = local_1d0;
  }
  pws[(long)pSSC32->leftfluxchan + -2] = local_1d4;
  pws[(long)pSSC32->rudderchan + 0x1e] = 1;
  pws[(long)pSSC32->rightthrusterchan + 0x1e] = 1;
  pws[(long)pSSC32->leftthrusterchan + 0x1e] = 1;
  pws[(long)pSSC32->rightfluxchan + 0x1e] = 1;
  pws[(long)pSSC32->leftfluxchan + 0x1e] = 1;
  iVar1 = SetAllPWMsSSC32(pSSC32,pws + 0x1e,(int *)&angletmp);
  return iVar1;
}

Assistant:

inline int SetRudderThrustersFluxSSC32(SSC32* pSSC32, double angle, double urt, double ult, double urf, double ulf)
{
	int selectedchannels[NB_CHANNELS_PWM_SSC32];
	int pws[NB_CHANNELS_PWM_SSC32];
#ifndef DISABLE_RUDDER_MIDANGLE
	double angletmp = 0;
#endif // DISABLE_RUDDER_MIDANGLE

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert angle (in rad) into SSC32 pulse width (in us).
#ifndef DISABLE_RUDDER_MIDANGLE
	angletmp = angle >= 0? pSSC32->MidAngle+angle*(pSSC32->MaxAngle-pSSC32->MidAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)): pSSC32->MidAngle+angle*(pSSC32->MidAngle-pSSC32->MinAngle)/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle));
	//angletmp = angle >= 0? pSSC32->MidAngle+urudder*(pSSC32->MaxAngle-pSSC32->MidAngle): pSSC32->MidAngle+urudder*(pSSC32->MidAngle-pSSC32->MinAngle);
	if (angletmp >= 0)
		pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
	else
		pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angletmp*(DEFAULT_MID_PW_SSC32-DEFAULT_MIN_PW_SSC32)
			/max(fabs(pSSC32->MinAngle),fabs(pSSC32->MaxAngle)));
#else
	pws[pSSC32->rudderchan] = DEFAULT_MID_PW_SSC32+(int)(angle*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)
		/(pSSC32->MaxAngle-pSSC32->MinAngle));
#endif // DISABLE_RUDDER_MIDANGLE
	// Convert u (in [-1;1]) into SSC32 pulse width (in us).
	pws[pSSC32->rightthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(urt*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->leftthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(ult*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->rightfluxchan] = DEFAULT_MID_PW_SSC32+(int)(urf*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->leftfluxchan] = DEFAULT_MID_PW_SSC32+(int)(ulf*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);

	pws[pSSC32->rudderchan] = max(min(pws[pSSC32->rudderchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->rightthrusterchan] = max(min(pws[pSSC32->rightthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->leftthrusterchan] = max(min(pws[pSSC32->leftthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->rightfluxchan] = max(min(pws[pSSC32->rightfluxchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->leftfluxchan] = max(min(pws[pSSC32->leftfluxchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);

	selectedchannels[pSSC32->rudderchan] = 1;
	selectedchannels[pSSC32->rightthrusterchan] = 1;
	selectedchannels[pSSC32->leftthrusterchan] = 1;
	selectedchannels[pSSC32->rightfluxchan] = 1;
	selectedchannels[pSSC32->leftfluxchan] = 1;

	return SetAllPWMsSSC32(pSSC32, selectedchannels, pws);
}